

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  Geometry *pGVar1;
  RTCFilterFunctionN p_Var2;
  undefined1 auVar3 [32];
  undefined1 (*pauVar4) [16];
  int iVar5;
  undefined4 uVar6;
  undefined1 (*pauVar7) [16];
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  AABBNodeMB4D *node1;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  vint4 bi_1;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 bi;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 ai;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  uint uVar54;
  uint uVar55;
  uint uVar56;
  undefined1 auVar53 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  long local_12c0;
  long local_12b8;
  long local_12b0;
  ulong local_12a8;
  Scene *local_12a0;
  ulong local_1298;
  RTCFilterFunctionNArguments local_1290;
  undefined1 local_1260 [32];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1150 [16];
  float local_1140 [4];
  float local_1130 [4];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined1 local_10f0 [16];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [16];
  undefined4 uStack_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  Scene *pSVar8;
  undefined1 auVar36 [32];
  undefined1 auVar39 [32];
  
  pauVar7 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar43 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar71 = ZEXT1664(CONCAT412(fVar43,CONCAT48(fVar43,CONCAT44(fVar43,fVar43))));
  fVar47 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_11c0._4_4_ = fVar47;
  local_11c0._0_4_ = fVar47;
  local_11c0._8_4_ = fVar47;
  local_11c0._12_4_ = fVar47;
  auVar46 = ZEXT1664(local_11c0);
  fVar48 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_11d0._4_4_ = fVar48;
  local_11d0._0_4_ = fVar48;
  local_11d0._8_4_ = fVar48;
  local_11d0._12_4_ = fVar48;
  auVar51 = ZEXT1664(local_11d0);
  fVar43 = fVar43 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar47 = fVar47 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar48 = fVar48 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1298 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar18 = uVar14 ^ 0x10;
  uVar20 = local_1298 ^ 0x10;
  iVar5 = (tray->tfar).field_0.i[k];
  auVar25 = ZEXT1664(CONCAT412(iVar5,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))));
  local_11b0._8_4_ = 0x80000000;
  local_11b0._0_8_ = 0x8000000080000000;
  local_11b0._12_4_ = 0x80000000;
  local_11e0._0_8_ = CONCAT44(fVar43,fVar43) ^ 0x8000000080000000;
  local_11e0._8_4_ = -fVar43;
  local_11e0._12_4_ = -fVar43;
  auVar53 = ZEXT1664(local_11e0);
  local_11f0._0_8_ = CONCAT44(fVar47,fVar47) ^ 0x8000000080000000;
  local_11f0._8_4_ = -fVar47;
  local_11f0._12_4_ = -fVar47;
  auVar58 = ZEXT1664(local_11f0);
  local_1200._0_8_ = CONCAT44(fVar48,fVar48) ^ 0x8000000080000000;
  local_1200._8_4_ = -fVar48;
  local_1200._12_4_ = -fVar48;
  auVar61 = ZEXT1664(local_1200);
  iVar5 = (tray->tnear).field_0.i[k];
  local_1210._4_4_ = iVar5;
  local_1210._0_4_ = iVar5;
  local_1210._8_4_ = iVar5;
  local_1210._12_4_ = iVar5;
  auVar64 = ZEXT1664(local_1210);
  iVar5 = 1 << ((uint)k & 0x1f);
  auVar32._4_4_ = iVar5;
  auVar32._0_4_ = iVar5;
  auVar32._8_4_ = iVar5;
  auVar32._12_4_ = iVar5;
  auVar32._16_4_ = iVar5;
  auVar32._20_4_ = iVar5;
  auVar32._24_4_ = iVar5;
  auVar32._28_4_ = iVar5;
  auVar36 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar32 = vpand_avx2(auVar32,auVar36);
  local_10e0 = vpcmpeqd_avx2(auVar32,auVar36);
LAB_005665a5:
  do {
    pauVar4 = pauVar7 + -1;
    pauVar7 = pauVar7 + -1;
    if (*(float *)(*pauVar4 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar19 = *(ulong *)*pauVar7;
      while ((uVar19 & 8) == 0) {
        uVar15 = uVar19 & 0xfffffffffffffff0;
        uVar6 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar26._4_4_ = uVar6;
        auVar26._0_4_ = uVar6;
        auVar26._8_4_ = uVar6;
        auVar26._12_4_ = uVar6;
        auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + uVar14),auVar26,
                                  *(undefined1 (*) [16])(uVar15 + 0x20 + uVar14));
        auVar27 = vfmadd213ps_fma(auVar27,auVar71._0_16_,auVar53._0_16_);
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + uVar17),auVar26,
                                  *(undefined1 (*) [16])(uVar15 + 0x20 + uVar17));
        auVar33 = vfmadd213ps_fma(auVar33,auVar46._0_16_,auVar58._0_16_);
        auVar27 = vpmaxsd_avx(auVar27,auVar33);
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + local_1298),auVar26,
                                  *(undefined1 (*) [16])(uVar15 + 0x20 + local_1298));
        auVar33 = vfmadd213ps_fma(auVar33,auVar51._0_16_,auVar61._0_16_);
        auVar33 = vpmaxsd_avx(auVar33,auVar64._0_16_);
        local_10c0 = vpmaxsd_avx(auVar27,auVar33);
        auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + uVar18),auVar26,
                                  *(undefined1 (*) [16])(uVar15 + 0x20 + uVar18));
        auVar27 = vfmadd213ps_fma(auVar27,auVar71._0_16_,auVar53._0_16_);
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + (uVar17 ^ 0x10)),auVar26,
                                  *(undefined1 (*) [16])(uVar15 + 0x20 + (uVar17 ^ 0x10)));
        auVar33 = vfmadd213ps_fma(auVar33,auVar46._0_16_,auVar58._0_16_);
        auVar27 = vpminsd_avx(auVar27,auVar33);
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80 + uVar20),auVar26,
                                  *(undefined1 (*) [16])(uVar15 + 0x20 + uVar20));
        auVar33 = vfmadd213ps_fma(auVar33,auVar51._0_16_,auVar61._0_16_);
        auVar33 = vpminsd_avx(auVar33,auVar25._0_16_);
        auVar27 = vpminsd_avx(auVar27,auVar33);
        if (((uint)uVar19 & 7) == 6) {
          auVar33 = vcmpps_avx(local_10c0,auVar27,2);
          auVar27 = vcmpps_avx(*(undefined1 (*) [16])(uVar15 + 0xe0),auVar26,2);
          auVar26 = vcmpps_avx(auVar26,*(undefined1 (*) [16])(uVar15 + 0xf0),1);
          auVar27 = vandps_avx(auVar27,auVar26);
          auVar27 = vandps_avx(auVar27,auVar33);
        }
        else {
          auVar27 = vcmpps_avx(local_10c0,auVar27,2);
        }
        auVar27 = vpslld_avx(auVar27,0x1f);
        uVar9 = vmovmskps_avx(auVar27);
        if (uVar9 == 0) {
          if (pauVar7 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_005665a5;
        }
        uVar9 = uVar9 & 0xff;
        lVar11 = 0;
        for (uVar19 = (ulong)uVar9; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          lVar11 = lVar11 + 1;
        }
        uVar19 = *(ulong *)(uVar15 + lVar11 * 8);
        uVar9 = uVar9 - 1 & uVar9;
        uVar10 = (ulong)uVar9;
        if (uVar9 != 0) {
          uVar54 = *(uint *)((RTCHitN *)local_10c0 + lVar11 * 4);
          lVar11 = 0;
          for (; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          uVar9 = uVar9 - 1 & uVar9;
          uVar12 = (ulong)uVar9;
          uVar10 = *(ulong *)(uVar15 + lVar11 * 8);
          uVar55 = *(uint *)((RTCHitN *)local_10c0 + lVar11 * 4);
          if (uVar9 == 0) {
            if (uVar54 < uVar55) {
              *(ulong *)*pauVar7 = uVar10;
              *(uint *)(*pauVar7 + 8) = uVar55;
              pauVar7 = pauVar7 + 1;
            }
            else {
              *(ulong *)*pauVar7 = uVar19;
              *(uint *)(*pauVar7 + 8) = uVar54;
              pauVar7 = pauVar7 + 1;
              uVar19 = uVar10;
            }
          }
          else {
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uVar19;
            auVar27 = vpunpcklqdq_avx(auVar27,ZEXT416(uVar54));
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar10;
            auVar33 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar55));
            lVar11 = 0;
            for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
              lVar11 = lVar11 + 1;
            }
            uVar9 = uVar9 - 1 & uVar9;
            uVar19 = (ulong)uVar9;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = *(ulong *)(uVar15 + lVar11 * 8);
            auVar37 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)((RTCHitN *)local_10c0 + lVar11 * 4))
                                     );
            auVar26 = vpcmpgtd_avx(auVar33,auVar27);
            if (uVar9 == 0) {
              auVar40 = vpshufd_avx(auVar26,0xaa);
              auVar26 = vblendvps_avx(auVar33,auVar27,auVar40);
              auVar27 = vblendvps_avx(auVar27,auVar33,auVar40);
              auVar33 = vpcmpgtd_avx(auVar37,auVar26);
              auVar40 = vpshufd_avx(auVar33,0xaa);
              auVar33 = vblendvps_avx(auVar37,auVar26,auVar40);
              auVar26 = vblendvps_avx(auVar26,auVar37,auVar40);
              auVar37 = vpcmpgtd_avx(auVar26,auVar27);
              auVar40 = vpshufd_avx(auVar37,0xaa);
              auVar37 = vblendvps_avx(auVar26,auVar27,auVar40);
              auVar27 = vblendvps_avx(auVar27,auVar26,auVar40);
              *pauVar7 = auVar27;
              pauVar7[1] = auVar37;
              uVar19 = auVar33._0_8_;
              pauVar7 = pauVar7 + 2;
            }
            else {
              lVar11 = 0;
              for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar11 = lVar11 + 1;
              }
              auVar40._8_8_ = 0;
              auVar40._0_8_ = *(ulong *)(uVar15 + lVar11 * 8);
              auVar45 = vpunpcklqdq_avx(auVar40,ZEXT416(*(uint *)((RTCHitN *)local_10c0 + lVar11 * 4
                                                                 )));
              auVar40 = vpshufd_avx(auVar26,0xaa);
              auVar26 = vblendvps_avx(auVar33,auVar27,auVar40);
              auVar27 = vblendvps_avx(auVar27,auVar33,auVar40);
              auVar33 = vpcmpgtd_avx(auVar45,auVar37);
              auVar40 = vpshufd_avx(auVar33,0xaa);
              auVar33 = vblendvps_avx(auVar45,auVar37,auVar40);
              auVar37 = vblendvps_avx(auVar37,auVar45,auVar40);
              auVar40 = vpcmpgtd_avx(auVar37,auVar27);
              auVar45 = vpshufd_avx(auVar40,0xaa);
              auVar40 = vblendvps_avx(auVar37,auVar27,auVar45);
              auVar27 = vblendvps_avx(auVar27,auVar37,auVar45);
              auVar37 = vpcmpgtd_avx(auVar33,auVar26);
              auVar45 = vpshufd_avx(auVar37,0xaa);
              auVar37 = vblendvps_avx(auVar33,auVar26,auVar45);
              auVar33 = vblendvps_avx(auVar26,auVar33,auVar45);
              auVar26 = vpcmpgtd_avx(auVar40,auVar33);
              auVar45 = vpshufd_avx(auVar26,0xaa);
              auVar26 = vblendvps_avx(auVar40,auVar33,auVar45);
              auVar33 = vblendvps_avx(auVar33,auVar40,auVar45);
              *pauVar7 = auVar27;
              pauVar7[1] = auVar33;
              pauVar7[2] = auVar26;
              uVar19 = auVar37._0_8_;
              pauVar7 = pauVar7 + 3;
            }
          }
        }
      }
      lVar11 = (ulong)((uint)uVar19 & 0xf) - 8;
      if (lVar11 != 0) {
        uVar19 = uVar19 & 0xfffffffffffffff0;
        lVar13 = 0;
        do {
          lVar16 = lVar13 * 0x140;
          uVar6 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar21._4_4_ = uVar6;
          auVar21._0_4_ = uVar6;
          auVar21._8_4_ = uVar6;
          auVar21._12_4_ = uVar6;
          auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x90 + lVar16),auVar21,
                                    *(undefined1 (*) [16])(uVar19 + lVar16));
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xa0 + lVar16),auVar21,
                                    *(undefined1 (*) [16])(uVar19 + 0x10 + lVar16));
          auVar29 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xb0 + lVar16),auVar21,
                                    *(undefined1 (*) [16])(uVar19 + 0x20 + lVar16));
          auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xc0 + lVar16),auVar21,
                                    *(undefined1 (*) [16])(uVar19 + 0x30 + lVar16));
          auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xd0 + lVar16),auVar21,
                                    *(undefined1 (*) [16])(uVar19 + 0x40 + lVar16));
          auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xe0 + lVar16),auVar21,
                                    *(undefined1 (*) [16])(uVar19 + 0x50 + lVar16));
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xf0 + lVar16),auVar21,
                                    *(undefined1 (*) [16])(uVar19 + 0x60 + lVar16));
          auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x100 + lVar16),auVar21,
                                    *(undefined1 (*) [16])(uVar19 + 0x70 + lVar16));
          auVar21 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x110 + lVar16),auVar21,
                                    *(undefined1 (*) [16])(uVar19 + 0x80 + lVar16));
          auVar33 = vsubps_avx(auVar34,auVar27);
          auVar27 = vsubps_avx(auVar42,auVar26);
          auVar26 = vsubps_avx(auVar29,auVar37);
          auVar37 = vsubps_avx(auVar40,auVar34);
          auVar40 = vsubps_avx(auVar45,auVar42);
          auVar45 = vsubps_avx(auVar21,auVar29);
          auVar22._0_4_ = auVar45._0_4_ * auVar27._0_4_;
          auVar22._4_4_ = auVar45._4_4_ * auVar27._4_4_;
          auVar22._8_4_ = auVar45._8_4_ * auVar27._8_4_;
          auVar22._12_4_ = auVar45._12_4_ * auVar27._12_4_;
          local_1110 = vfmsub231ps_fma(auVar22,auVar40,auVar26);
          auVar28._0_4_ = auVar26._0_4_ * auVar37._0_4_;
          auVar28._4_4_ = auVar26._4_4_ * auVar37._4_4_;
          auVar28._8_4_ = auVar26._8_4_ * auVar37._8_4_;
          auVar28._12_4_ = auVar26._12_4_ * auVar37._12_4_;
          local_1100 = vfmsub231ps_fma(auVar28,auVar45,auVar33);
          uVar6 = *(undefined4 *)(ray + k * 4);
          auVar62._4_4_ = uVar6;
          auVar62._0_4_ = uVar6;
          auVar62._8_4_ = uVar6;
          auVar62._12_4_ = uVar6;
          uVar6 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar65._4_4_ = uVar6;
          auVar65._0_4_ = uVar6;
          auVar65._8_4_ = uVar6;
          auVar65._12_4_ = uVar6;
          uVar6 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar68._4_4_ = uVar6;
          auVar68._0_4_ = uVar6;
          auVar68._8_4_ = uVar6;
          auVar68._12_4_ = uVar6;
          fVar43 = *(float *)(ray + k * 4 + 0x80);
          auVar57._4_4_ = fVar43;
          auVar57._0_4_ = fVar43;
          auVar57._8_4_ = fVar43;
          auVar57._12_4_ = fVar43;
          auVar34 = vsubps_avx(auVar34,auVar62);
          fVar47 = *(float *)(ray + k * 4 + 0xa0);
          auVar63._4_4_ = fVar47;
          auVar63._0_4_ = fVar47;
          auVar63._8_4_ = fVar47;
          auVar63._12_4_ = fVar47;
          auVar42 = vsubps_avx(auVar42,auVar65);
          fVar48 = *(float *)(ray + k * 4 + 0xc0);
          auVar66._4_4_ = fVar48;
          auVar66._0_4_ = fVar48;
          auVar66._8_4_ = fVar48;
          auVar66._12_4_ = fVar48;
          auVar29 = vsubps_avx(auVar29,auVar68);
          auVar69._0_4_ = fVar43 * auVar42._0_4_;
          auVar69._4_4_ = fVar43 * auVar42._4_4_;
          auVar69._8_4_ = fVar43 * auVar42._8_4_;
          auVar69._12_4_ = fVar43 * auVar42._12_4_;
          auVar21 = vfmsub231ps_fma(auVar69,auVar34,auVar63);
          auVar59._0_4_ = auVar45._0_4_ * auVar21._0_4_;
          auVar59._4_4_ = auVar45._4_4_ * auVar21._4_4_;
          auVar59._8_4_ = auVar45._8_4_ * auVar21._8_4_;
          auVar59._12_4_ = auVar45._12_4_ * auVar21._12_4_;
          auVar70._0_4_ = auVar26._0_4_ * auVar21._0_4_;
          auVar70._4_4_ = auVar26._4_4_ * auVar21._4_4_;
          auVar70._8_4_ = auVar26._8_4_ * auVar21._8_4_;
          auVar70._12_4_ = auVar26._12_4_ * auVar21._12_4_;
          auVar52._0_4_ = fVar48 * auVar34._0_4_;
          auVar52._4_4_ = fVar48 * auVar34._4_4_;
          auVar52._8_4_ = fVar48 * auVar34._8_4_;
          auVar52._12_4_ = fVar48 * auVar34._12_4_;
          auVar45 = vfmsub231ps_fma(auVar52,auVar29,auVar57);
          auVar26 = vfmadd231ps_fma(auVar59,auVar45,auVar40);
          auVar45 = vfmadd231ps_fma(auVar70,auVar27,auVar45);
          auVar50._0_4_ = auVar40._0_4_ * auVar33._0_4_;
          auVar50._4_4_ = auVar40._4_4_ * auVar33._4_4_;
          auVar50._8_4_ = auVar40._8_4_ * auVar33._8_4_;
          auVar50._12_4_ = auVar40._12_4_ * auVar33._12_4_;
          local_10f0 = vfmsub231ps_fma(auVar50,auVar37,auVar27);
          auVar44._0_4_ = fVar47 * auVar29._0_4_;
          auVar44._4_4_ = fVar47 * auVar29._4_4_;
          auVar44._8_4_ = fVar47 * auVar29._8_4_;
          auVar44._12_4_ = fVar47 * auVar29._12_4_;
          auVar21 = vfmsub231ps_fma(auVar44,auVar42,auVar66);
          auVar67._0_4_ = local_10f0._0_4_ * fVar48;
          auVar67._4_4_ = local_10f0._4_4_ * fVar48;
          auVar67._8_4_ = local_10f0._8_4_ * fVar48;
          auVar67._12_4_ = local_10f0._12_4_ * fVar48;
          auVar27 = vfmadd231ps_fma(auVar67,local_1100,auVar63);
          auVar40 = vfmadd231ps_fma(auVar27,local_1110,auVar57);
          auVar26 = vfmadd231ps_fma(auVar26,auVar21,auVar37);
          auVar27 = vandps_avx(auVar40,local_11b0);
          uVar9 = auVar27._0_4_;
          local_11a0._0_4_ = (float)(uVar9 ^ auVar26._0_4_);
          uVar54 = auVar27._4_4_;
          local_11a0._4_4_ = (float)(uVar54 ^ auVar26._4_4_);
          uVar55 = auVar27._8_4_;
          local_11a0._8_4_ = (float)(uVar55 ^ auVar26._8_4_);
          uVar56 = auVar27._12_4_;
          local_11a0._12_4_ = (float)(uVar56 ^ auVar26._12_4_);
          auVar27 = vfmadd231ps_fma(auVar45,auVar33,auVar21);
          local_1190._0_4_ = (float)(uVar9 ^ auVar27._0_4_);
          local_1190._4_4_ = (float)(uVar54 ^ auVar27._4_4_);
          local_1190._8_4_ = (float)(uVar55 ^ auVar27._8_4_);
          local_1190._12_4_ = (float)(uVar56 ^ auVar27._12_4_);
          auVar26 = ZEXT816(0) << 0x20;
          auVar27 = vcmpps_avx(local_11a0,auVar26,5);
          auVar33 = vcmpps_avx(local_1190,auVar26,5);
          auVar27 = vandps_avx(auVar33,auVar27);
          auVar45._8_4_ = 0x7fffffff;
          auVar45._0_8_ = 0x7fffffff7fffffff;
          auVar45._12_4_ = 0x7fffffff;
          local_1170 = vandps_avx(auVar40,auVar45);
          auVar33 = vcmpps_avx(auVar40,auVar26,4);
          auVar27 = vandps_avx(auVar27,auVar33);
          auVar60._0_4_ = local_11a0._0_4_ + local_1190._0_4_;
          auVar60._4_4_ = local_11a0._4_4_ + local_1190._4_4_;
          auVar60._8_4_ = local_11a0._8_4_ + local_1190._8_4_;
          auVar60._12_4_ = local_11a0._12_4_ + local_1190._12_4_;
          auVar33 = vcmpps_avx(auVar60,local_1170,2);
          auVar26 = auVar33 & auVar27;
          if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar26[0xf] < '\0') {
            auVar27 = vandps_avx(auVar27,auVar33);
            auVar41._0_4_ = local_10f0._0_4_ * auVar29._0_4_;
            auVar41._4_4_ = local_10f0._4_4_ * auVar29._4_4_;
            auVar41._8_4_ = local_10f0._8_4_ * auVar29._8_4_;
            auVar41._12_4_ = local_10f0._12_4_ * auVar29._12_4_;
            auVar33 = vfmadd213ps_fma(auVar42,local_1100,auVar41);
            auVar33 = vfmadd213ps_fma(auVar34,local_1110,auVar33);
            local_1180._0_4_ = (float)(uVar9 ^ auVar33._0_4_);
            local_1180._4_4_ = (float)(uVar54 ^ auVar33._4_4_);
            local_1180._8_4_ = (float)(uVar55 ^ auVar33._8_4_);
            local_1180._12_4_ = (float)(uVar56 ^ auVar33._12_4_);
            fVar43 = *(float *)(ray + k * 4 + 0x60);
            auVar34._0_4_ = local_1170._0_4_ * fVar43;
            auVar34._4_4_ = local_1170._4_4_ * fVar43;
            auVar34._8_4_ = local_1170._8_4_ * fVar43;
            auVar34._12_4_ = local_1170._12_4_ * fVar43;
            auVar33 = vcmpps_avx(auVar34,local_1180,1);
            fVar43 = *(float *)(ray + k * 4 + 0x100);
            auVar25 = ZEXT1664(CONCAT412(fVar43,CONCAT48(fVar43,CONCAT44(fVar43,fVar43))));
            auVar42._0_4_ = fVar43 * local_1170._0_4_;
            auVar42._4_4_ = fVar43 * local_1170._4_4_;
            auVar42._8_4_ = fVar43 * local_1170._8_4_;
            auVar42._12_4_ = fVar43 * local_1170._12_4_;
            auVar26 = vcmpps_avx(local_1180,auVar42,2);
            auVar33 = vandps_avx(auVar33,auVar26);
            auVar26 = auVar27 & auVar33;
            if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar26[0xf] < '\0') {
              local_12e0 = vandps_avx(auVar27,auVar33);
              pSVar8 = context->scene;
              auVar27 = vrcpps_avx(local_1170);
              auVar29._8_4_ = 0x3f800000;
              auVar29._0_8_ = 0x3f8000003f800000;
              auVar29._12_4_ = 0x3f800000;
              auVar33 = vfnmadd213ps_fma(local_1170,auVar27,auVar29);
              auVar27 = vfmadd132ps_fma(auVar33,auVar27,auVar27);
              fVar43 = auVar27._0_4_;
              local_1120._0_4_ = fVar43 * local_1180._0_4_;
              fVar47 = auVar27._4_4_;
              local_1120._4_4_ = fVar47 * local_1180._4_4_;
              fVar48 = auVar27._8_4_;
              local_1120._8_4_ = fVar48 * local_1180._8_4_;
              fVar49 = auVar27._12_4_;
              local_1120._12_4_ = fVar49 * local_1180._12_4_;
              auVar46 = ZEXT1664(local_1120);
              local_1140[0] = fVar43 * local_11a0._0_4_;
              local_1140[1] = fVar47 * local_11a0._4_4_;
              local_1140[2] = fVar48 * local_11a0._8_4_;
              local_1140[3] = fVar49 * local_11a0._12_4_;
              auVar30._8_4_ = 0x7f800000;
              auVar30._0_8_ = 0x7f8000007f800000;
              auVar30._12_4_ = 0x7f800000;
              auVar27 = vblendvps_avx(auVar30,local_1120,local_12e0);
              local_1130[0] = fVar43 * local_1190._0_4_;
              local_1130[1] = fVar47 * local_1190._4_4_;
              local_1130[2] = fVar48 * local_1190._8_4_;
              local_1130[3] = fVar49 * local_1190._12_4_;
              auVar33 = vshufps_avx(auVar27,auVar27,0xb1);
              auVar33 = vminps_avx(auVar33,auVar27);
              auVar26 = vshufpd_avx(auVar33,auVar33,1);
              auVar33 = vminps_avx(auVar26,auVar33);
              auVar27 = vcmpps_avx(auVar27,auVar33,0);
              auVar26 = local_12e0 & auVar27;
              auVar33 = vpcmpeqd_avx(auVar33,auVar33);
              if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar26[0xf] < '\0') {
                auVar33 = auVar27;
              }
              lVar16 = lVar16 + uVar19;
              auVar27 = vandps_avx(local_12e0,auVar33);
              auVar51 = ZEXT1664(auVar27);
              local_12a0 = pSVar8;
              local_1150 = local_12e0;
LAB_00566bee:
              local_1220 = auVar71._0_16_;
              local_12d0 = auVar25._0_16_;
              uVar15 = (ulong)pSVar8 >> 0x20;
              uVar6 = vmovmskps_avx(auVar51._0_16_);
              pSVar8 = (Scene *)0x0;
              for (uVar15 = CONCAT44((int)uVar15,uVar6); (uVar15 & 1) == 0;
                  uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                pSVar8 = (Scene *)((long)&(pSVar8->super_AccelN).super_Accel.super_AccelData.
                                          super_RefCount._vptr_RefCount + 1);
              }
              uVar9 = *(uint *)(lVar16 + 0x120 + (long)pSVar8 * 4);
              pGVar1 = (local_12a0->geometries).items[uVar9].ptr;
              if ((pGVar1->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_12e0 + (long)pSVar8 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar1->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar43 = local_1140[(long)pSVar8];
                  fVar47 = local_1130[(long)pSVar8];
                  *(undefined4 *)(ray + k * 4 + 0x100) =
                       *(undefined4 *)(local_1120 + (long)pSVar8 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x180) =
                       *(undefined4 *)(local_1110 + (long)pSVar8 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) =
                       *(undefined4 *)(local_1100 + (long)pSVar8 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) =
                       *(undefined4 *)(local_10f0 + (long)pSVar8 * 4);
                  *(float *)(ray + k * 4 + 0x1e0) = fVar43;
                  *(float *)(ray + k * 4 + 0x200) = fVar47;
                  *(undefined4 *)(ray + k * 4 + 0x220) =
                       *(undefined4 *)(lVar16 + 0x130 + (long)pSVar8 * 4);
                  *(uint *)(ray + k * 4 + 0x240) = uVar9;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  goto LAB_00566abd;
                }
                local_1230 = auVar46._0_16_;
                fVar43 = local_1140[(long)pSVar8];
                local_1060._4_4_ = fVar43;
                local_1060._0_4_ = fVar43;
                local_1060._8_4_ = fVar43;
                local_1060._12_4_ = fVar43;
                local_1060._16_4_ = fVar43;
                local_1060._20_4_ = fVar43;
                local_1060._24_4_ = fVar43;
                local_1060._28_4_ = fVar43;
                local_1040 = local_1130[(long)pSVar8];
                uVar6 = *(undefined4 *)(lVar16 + 0x130 + (long)pSVar8 * 4);
                auVar38._4_4_ = uVar6;
                auVar38._0_4_ = uVar6;
                auVar38._8_4_ = uVar6;
                auVar38._12_4_ = uVar6;
                auVar39._16_4_ = uVar6;
                auVar39._0_16_ = auVar38;
                auVar39._20_4_ = uVar6;
                auVar39._24_4_ = uVar6;
                auVar39._28_4_ = uVar6;
                local_10c0._4_4_ = *(undefined4 *)(local_1110 + (long)pSVar8 * 4);
                uVar6 = *(undefined4 *)(local_1100 + (long)pSVar8 * 4);
                local_10a0._4_4_ = uVar6;
                local_10a0._0_4_ = uVar6;
                local_10a0._8_4_ = uVar6;
                local_10a0._12_4_ = uVar6;
                local_10a0._16_4_ = uVar6;
                local_10a0._20_4_ = uVar6;
                local_10a0._24_4_ = uVar6;
                local_10a0._28_4_ = uVar6;
                uVar6 = *(undefined4 *)(local_10f0 + (long)pSVar8 * 4);
                local_1080._4_4_ = uVar6;
                local_1080._0_4_ = uVar6;
                local_1080._8_4_ = uVar6;
                local_1080._12_4_ = uVar6;
                local_1080._16_4_ = uVar6;
                local_1080._20_4_ = uVar6;
                local_1080._24_4_ = uVar6;
                local_1080._28_4_ = uVar6;
                auVar35._4_4_ = uVar9;
                auVar35._0_4_ = uVar9;
                auVar35._8_4_ = uVar9;
                auVar35._12_4_ = uVar9;
                auVar36._16_4_ = uVar9;
                auVar36._0_16_ = auVar35;
                auVar36._20_4_ = uVar9;
                auVar36._24_4_ = uVar9;
                auVar36._28_4_ = uVar9;
                local_10c0._0_4_ = local_10c0._4_4_;
                local_10c0._8_4_ = local_10c0._4_4_;
                local_10c0._12_4_ = local_10c0._4_4_;
                uStack_10b0 = local_10c0._4_4_;
                uStack_10ac = local_10c0._4_4_;
                uStack_10a8 = local_10c0._4_4_;
                uStack_10a4 = local_10c0._4_4_;
                fStack_103c = local_1040;
                fStack_1038 = local_1040;
                fStack_1034 = local_1040;
                fStack_1030 = local_1040;
                fStack_102c = local_1040;
                fStack_1028 = local_1040;
                fStack_1024 = local_1040;
                local_1020 = auVar39;
                local_1000 = auVar36;
                vpcmpeqd_avx2(local_1060,local_1060);
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                *(undefined4 *)(ray + k * 4 + 0x100) =
                     *(undefined4 *)(local_1120 + (long)pSVar8 * 4);
                local_1260 = local_10e0;
                local_1290.valid = (int *)local_1260;
                local_1290.geometryUserPtr = pGVar1->userPtr;
                local_1290.context = context->user;
                local_1290.hit = (RTCHitN *)local_10c0;
                local_1290.N = 8;
                local_12c0 = lVar16;
                local_12b8 = lVar13;
                local_12b0 = lVar11;
                local_12a8 = uVar14;
                local_1290.ray = (RTCRayN *)ray;
                if (pGVar1->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar36 = ZEXT1632(auVar35);
                  auVar39 = ZEXT1632(auVar38);
                  (*pGVar1->intersectionFilterN)(&local_1290);
                }
                auVar24 = vpcmpeqd_avx2(local_1260,_DAT_01faff00);
                auVar32 = _DAT_01fe9960 & ~auVar24;
                if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar32 >> 0x7f,0) == '\0') &&
                      (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar32 >> 0xbf,0) == '\0') &&
                    (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar32[0x1f]) {
                  auVar24 = auVar24 ^ _DAT_01fe9960;
                }
                else {
                  p_Var2 = context->args->filter;
                  if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar1->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar36 = ZEXT1632(auVar36._0_16_);
                    auVar39 = ZEXT1632(auVar39._0_16_);
                    (*p_Var2)(&local_1290);
                  }
                  auVar3 = vpcmpeqd_avx2(local_1260,_DAT_01faff00);
                  auVar32 = vpcmpeqd_avx2(auVar39,auVar39);
                  auVar24 = auVar3 ^ auVar32;
                  auVar36 = vpcmpeqd_avx2(auVar36,auVar36);
                  auVar32 = auVar32 & ~auVar3;
                  if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar32 >> 0x7f,0) != '\0') ||
                        (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar32 >> 0xbf,0) != '\0') ||
                      (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar32[0x1f] < '\0') {
                    auVar3 = auVar3 ^ auVar36;
                    auVar32 = vmaskmovps_avx(auVar3,*(undefined1 (*) [32])local_1290.hit);
                    *(undefined1 (*) [32])(local_1290.ray + 0x180) = auVar32;
                    auVar32 = vmaskmovps_avx(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0x20));
                    *(undefined1 (*) [32])(local_1290.ray + 0x1a0) = auVar32;
                    auVar32 = vmaskmovps_avx(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0x40));
                    *(undefined1 (*) [32])(local_1290.ray + 0x1c0) = auVar32;
                    auVar32 = vmaskmovps_avx(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0x60));
                    *(undefined1 (*) [32])(local_1290.ray + 0x1e0) = auVar32;
                    auVar32 = vmaskmovps_avx(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0x80));
                    *(undefined1 (*) [32])(local_1290.ray + 0x200) = auVar32;
                    auVar32 = vpmaskmovd_avx2(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0xa0));
                    *(undefined1 (*) [32])(local_1290.ray + 0x220) = auVar32;
                    auVar32 = vpmaskmovd_avx2(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0xc0));
                    *(undefined1 (*) [32])(local_1290.ray + 0x240) = auVar32;
                    auVar32 = vpmaskmovd_avx2(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0xe0));
                    *(undefined1 (*) [32])(local_1290.ray + 0x260) = auVar32;
                    auVar32 = vpmaskmovd_avx2(auVar3,*(undefined1 (*) [32])(local_1290.hit + 0x100))
                    ;
                    *(undefined1 (*) [32])(local_1290.ray + 0x280) = auVar32;
                  }
                }
                if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar24 >> 0x7f,0) == '\0') &&
                      (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar24 >> 0xbf,0) == '\0') &&
                    (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar24[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = local_12d0._0_4_;
                }
                else {
                  local_12d0 = ZEXT416(*(uint *)(ray + k * 4 + 0x100));
                }
                *(undefined4 *)(local_12e0 + (long)pSVar8 * 4) = 0;
                auVar25 = ZEXT1664(local_12d0);
                uVar6 = local_12d0._0_4_;
                auVar23._4_4_ = uVar6;
                auVar23._0_4_ = uVar6;
                auVar23._8_4_ = uVar6;
                auVar23._12_4_ = uVar6;
                auVar46 = ZEXT1664(local_1230);
                auVar27 = vcmpps_avx(local_1230,auVar23,2);
                local_12e0 = vandps_avx(auVar27,local_12e0);
                auVar71 = ZEXT1664(local_1220);
                lVar11 = local_12b0;
                lVar13 = local_12b8;
                uVar14 = local_12a8;
                lVar16 = local_12c0;
              }
              auVar51 = ZEXT1664(local_12e0);
              if ((((local_12e0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_12e0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_12e0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_12e0[0xf]) goto LAB_00566abd;
              auVar31._8_4_ = 0x7f800000;
              auVar31._0_8_ = 0x7f8000007f800000;
              auVar31._12_4_ = 0x7f800000;
              auVar27 = vblendvps_avx(auVar31,auVar46._0_16_,local_12e0);
              auVar33 = vshufps_avx(auVar27,auVar27,0xb1);
              auVar33 = vminps_avx(auVar33,auVar27);
              auVar26 = vshufpd_avx(auVar33,auVar33,1);
              auVar33 = vminps_avx(auVar26,auVar33);
              auVar27 = vcmpps_avx(auVar27,auVar33,0);
              auVar33 = local_12e0 & auVar27;
              if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar33[0xf] < '\0') {
                auVar27 = vandps_avx(auVar27,local_12e0);
                auVar51 = ZEXT1664(auVar27);
              }
              goto LAB_00566bee;
            }
          }
LAB_00566abd:
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar11);
      }
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar25 = ZEXT1664(CONCAT412(uVar6,CONCAT48(uVar6,CONCAT44(uVar6,uVar6))));
      auVar46 = ZEXT1664(local_11c0);
      auVar51 = ZEXT1664(local_11d0);
      auVar53 = ZEXT1664(local_11e0);
      auVar58 = ZEXT1664(local_11f0);
      auVar61 = ZEXT1664(local_1200);
      auVar64 = ZEXT1664(local_1210);
    }
    if (pauVar7 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }